

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O0

shared_ptr<avro::Node> * __thiscall
avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>::get
          (SingleAttribute<boost::shared_ptr<avro::Node>_> *this,size_t index)

{
  Exception *this_00;
  long in_RSI;
  shared_ptr<avro::Node> *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if (in_RSI != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    Exception::Exception(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return in_RDI;
}

Assistant:

const Attribute &get(size_t index = 0) const {
        if (index != 0) {
            throw Exception("SingleAttribute has only 1 value");
        }
        return attr_;
    }